

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O1

int mbedtls_ecdsa_verify
              (mbedtls_ecp_group *grp,uchar *buf,size_t blen,mbedtls_ecp_point *Q,mbedtls_mpi *r,
              mbedtls_mpi *s)

{
  mbedtls_mpi *Y;
  int iVar1;
  int iVar2;
  int iVar3;
  mbedtls_mpi mStack_d8;
  mbedtls_mpi mStack_c0;
  mbedtls_mpi mStack_a8;
  mbedtls_mpi mStack_90;
  mbedtls_ecp_point mStack_78;
  
  mbedtls_ecp_point_init(&mStack_78);
  mbedtls_mpi_init(&mStack_90);
  mbedtls_mpi_init(&mStack_a8);
  mbedtls_mpi_init(&mStack_c0);
  mbedtls_mpi_init(&mStack_d8);
  iVar2 = -0x4f80;
  if (((grp->id - MBEDTLS_ECP_DP_CURVE25519 & 0xfffffffb) != 0) &&
     ((grp->N).p != (mbedtls_mpi_uint *)0x0)) {
    iVar1 = mbedtls_mpi_cmp_int(r,1);
    iVar3 = -0x4e00;
    iVar2 = iVar3;
    if (-1 < iVar1) {
      Y = &grp->N;
      iVar1 = mbedtls_mpi_cmp_mpi(r,Y);
      if (((((iVar1 < 0) && (iVar1 = mbedtls_mpi_cmp_int(s,1), -1 < iVar1)) &&
           (iVar1 = mbedtls_mpi_cmp_mpi(s,Y), iVar1 < 0)) &&
          ((((iVar2 = derive_mpi(grp,&mStack_90,buf,blen), iVar2 == 0 &&
             (iVar2 = mbedtls_mpi_inv_mod(&mStack_a8,s,Y), iVar2 == 0)) &&
            ((iVar2 = mbedtls_mpi_mul_mpi(&mStack_c0,&mStack_90,&mStack_a8), iVar2 == 0 &&
             ((iVar2 = mbedtls_mpi_mod_mpi(&mStack_c0,&mStack_c0,Y), iVar2 == 0 &&
              (iVar2 = mbedtls_mpi_mul_mpi(&mStack_d8,r,&mStack_a8), iVar2 == 0)))))) &&
           (iVar2 = mbedtls_mpi_mod_mpi(&mStack_d8,&mStack_d8,Y), iVar2 == 0)))) &&
         (((iVar2 = mbedtls_ecp_muladd_restartable
                              (grp,&mStack_78,&mStack_c0,&grp->G,&mStack_d8,Q,
                               (mbedtls_ecp_restart_ctx *)0x0), iVar2 == 0 &&
           (iVar1 = mbedtls_ecp_is_zero(&mStack_78), iVar2 = iVar3, iVar1 == 0)) &&
          (iVar2 = mbedtls_mpi_mod_mpi(&mStack_78.X,&mStack_78.X,Y), iVar2 == 0)))) {
        iVar1 = mbedtls_mpi_cmp_mpi(&mStack_78.X,r);
        iVar2 = -0x4e00;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
      }
    }
    mbedtls_ecp_point_free(&mStack_78);
    mbedtls_mpi_free(&mStack_90);
    mbedtls_mpi_free(&mStack_a8);
    mbedtls_mpi_free(&mStack_c0);
    mbedtls_mpi_free(&mStack_d8);
  }
  return iVar2;
}

Assistant:

int mbedtls_ecdsa_verify( mbedtls_ecp_group *grp,
                          const unsigned char *buf, size_t blen,
                          const mbedtls_ecp_point *Q,
                          const mbedtls_mpi *r,
                          const mbedtls_mpi *s)
{
    ECDSA_VALIDATE_RET( grp != NULL );
    ECDSA_VALIDATE_RET( Q   != NULL );
    ECDSA_VALIDATE_RET( r   != NULL );
    ECDSA_VALIDATE_RET( s   != NULL );
    ECDSA_VALIDATE_RET( buf != NULL || blen == 0 );

    return( ecdsa_verify_restartable( grp, buf, blen, Q, r, s, NULL ) );
}